

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O1

bool __thiscall OneKey::check(OneKey *this,AActor *owner)

{
  PClass *pPVar1;
  PClassActor *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AInventory *pAVar5;
  PClass *pPVar6;
  AInventory *pAVar7;
  bool bVar8;
  int local_30;
  int local_2c;
  
  pPVar3 = AKey::RegistrationInfo.MyClass;
  if ((owner->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(owner->super_DThinker).super_DObject._vptr_DObject)(owner);
    (owner->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
  }
  pPVar1 = (owner->super_DThinker).super_DObject.Class;
  bVar8 = pPVar1 != (PClass *)0x0;
  pPVar6 = pPVar1;
  if (pPVar1 != pPVar3 && bVar8) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar8 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (bVar8) {
    pPVar2 = this->key;
    if (pPVar1 == (PClass *)0x0) {
      iVar4 = (**(owner->super_DThinker).super_DObject._vptr_DObject)(owner);
      (owner->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    if ((PClassActor *)(owner->super_DThinker).super_DObject.Class == pPVar2) {
      bVar8 = true;
    }
    else {
      (*(owner->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_2c,owner);
      bVar8 = local_2c == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    }
  }
  else {
    pAVar7 = (owner->Inventory).field_0.p;
    if ((pAVar7 != (AInventory *)0x0) &&
       (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (owner->Inventory).field_0.p = (AInventory *)0x0;
      pAVar7 = (AInventory *)0x0;
    }
    bVar8 = pAVar7 != (AInventory *)0x0;
    if (bVar8) {
      do {
        pPVar2 = this->key;
        if ((pAVar7->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar7);
          (pAVar7->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_01,iVar4);
        }
        if ((PClassActor *)(pAVar7->super_AActor).super_DThinker.super_DObject.Class == pPVar2) {
          return true;
        }
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x21])(&local_30,pAVar7)
        ;
        if (local_30 == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index) {
          return true;
        }
        pAVar5 = (pAVar7->super_AActor).Inventory.field_0.p;
        if ((pAVar5 != (AInventory *)0x0) &&
           (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar7->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar5 = (AInventory *)0x0;
        }
        bVar8 = pAVar5 != (AInventory *)0x0;
        pAVar7 = pAVar5;
      } while (bVar8);
    }
  }
  return bVar8;
}

Assistant:

bool check(AActor *owner)
	{
		if (owner->IsKindOf(RUNTIME_CLASS(AKey)))
		{
			// P_GetMapColorForKey() checks the key directly
			return owner->IsA(key) || owner->GetSpecies() == key->TypeName;
		}
		else 
		{
			// Other calls check an actor that may have a key in its inventory.
			AInventory *item;

			for (item = owner->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsA(key))
				{
					return true;
				}
				else if (item->GetSpecies() == key->TypeName)
				{
					return true;
				}
			}
			return false;
		}
	}